

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Ptr * wabt::interp::Instance::Instantiate
                (Ptr *__return_storage_ptr__,Store *store,Ref module,RefVec *imports,Ptr *out_trap)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer pFVar3;
  void *pvVar4;
  pointer pTVar5;
  pointer pMVar6;
  pointer pGVar7;
  pointer pEVar8;
  pointer pEVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ElemSegment *pEVar11;
  ElemDesc *pEVar12;
  pointer pDVar13;
  DataDesc *pDVar14;
  pointer pSVar15;
  undefined8 uVar16;
  bool bVar17;
  undefined8 index;
  undefined8 uVar18;
  bool bVar19;
  int iVar20;
  Result RVar21;
  Ref *pRVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  pointer pRVar25;
  pointer pRVar26;
  GlobalDesc *desc_3;
  pointer pGVar27;
  pointer pEVar28;
  ElemSegment *src;
  pointer src_00;
  FuncDesc *desc;
  pointer pFVar29;
  pointer pTVar30;
  pointer pMVar31;
  Ptr *out_trap_00;
  iterator iVar32;
  Instance *pIVar33;
  vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *this;
  ulong uVar34;
  ElemDesc *desc_5;
  long lVar35;
  long lVar36;
  pointer pSVar37;
  ExportDesc *desc_4;
  pointer pEVar38;
  ulong uVar39;
  Ref ref;
  Values results;
  Ref extern_ref;
  anon_union_16_6_113bff37_for_Value_0 local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Any_data local_1e8;
  Index local_1d8;
  RefPtr<wabt::interp::Instance> local_1c8;
  Ptr *local_1b0;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_1a8;
  Ptr *local_188;
  RefPtr<wabt::interp::Module> local_180;
  RefPtr<wabt::interp::Trap> local_168;
  long local_150;
  RefVec *local_148;
  GlobalType local_140;
  EventType local_128;
  anon_union_16_6_113bff37_for_Value_0 local_100;
  Index local_f0;
  Ref local_e8;
  FuncDesc local_e0;
  MemoryType local_80;
  TableType local_58;
  
  local_1b0 = __return_storage_ptr__;
  local_e8.index = module.index;
  RefPtr<wabt::interp::Module>::RefPtr(&local_180,store,module);
  Store::Alloc<wabt::interp::Instance,wabt::interp::Store&,wabt::interp::Ref&>
            (&local_1c8,store,store,&local_e8);
  pIVar1 = ((local_180.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pIVar2 = ((local_180.obj_)->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar34 = ((long)pIVar2 - (long)pIVar1 >> 3) * -0x71c71c71c71c71c7;
  local_148 = imports;
  if ((ulong)((long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(imports->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar34) {
    local_208.i64_ = (u64)&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"not enough imports!","");
    local_168.root_index_ = 0;
    local_168.obj_ = (Trap *)0x0;
    local_168.store_ = (Store *)0x0;
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              ((RefPtr<wabt::interp::Trap> *)&local_1e8,store,store,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208.v128_
               ,(vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168);
    out_trap->obj_ = (Trap *)local_1e8._M_unused._0_8_;
    out_trap->store_ = (Store *)local_1e8._8_8_;
    out_trap->root_index_ = local_1d8;
    local_1d8 = 0;
    local_1e8._M_unused._M_object =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1e8._8_8_ = (Store *)0x0;
    if (local_168.obj_ != (Trap *)0x0) {
      operator_delete(local_168.obj_);
    }
LAB_002453bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.i64_ != &local_1f8) {
      operator_delete((void *)local_208.i64_);
    }
    local_1b0->obj_ = (Instance *)0x0;
    local_1b0->store_ = (Store *)0x0;
    local_1b0->root_index_ = 0;
LAB_0024619c:
    if (local_1c8.obj_ != (Instance *)0x0) {
      FreeList<wabt::interp::Ref>::Delete(&(local_1c8.store_)->roots_,local_1c8.root_index_);
    }
  }
  else {
    if (pIVar2 != pIVar1) {
      local_150 = uVar34 + (uVar34 == 0);
      lVar36 = 0;
      lVar35 = 0;
      do {
        pIVar1 = ((local_180.obj_)->desc_).imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1a8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)(local_148->
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
                      _M_impl.super__Vector_impl_data._M_start[lVar35].index;
        if (local_1a8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
            _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          StringPrintf_abi_cxx11_
                    ((string *)&local_208.v128_,"invalid import \"%s.%s\"",
                     *(undefined8 *)((long)&(pIVar1->type).module._M_dataplus + lVar36),
                     *(undefined8 *)((long)&(pIVar1->type).name._M_dataplus + lVar36));
          local_168.root_index_ = 0;
          local_168.obj_ = (Trap *)0x0;
          local_168.store_ = (Store *)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    ((RefPtr<wabt::interp::Trap> *)&local_1e8,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_208.v128_,
                     (vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *)&local_168
                    );
          out_trap->obj_ = (Trap *)local_1e8._M_unused._0_8_;
          out_trap->store_ = (Store *)local_1e8._8_8_;
          out_trap->root_index_ = local_1d8;
          local_1d8 = 0;
          local_1e8._M_unused._M_object =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1e8._8_8_ = (Store *)0x0;
          if (local_168.obj_ != (Trap *)0x0) {
            operator_delete(local_168.obj_);
          }
          goto LAB_002453bf;
        }
        RefPtr<wabt::interp::Extern>::RefPtr
                  ((RefPtr<wabt::interp::Extern> *)&local_208.v128_,store,
                   (Ref)local_1a8.
                        super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar20 = (**(code **)(*(size_type *)local_208.i64_ + 0x18))
                           (local_208.i64_,store,(long)&(pIVar1->type).module._M_dataplus + lVar36,
                            out_trap);
        if (iVar20 == 1) {
          local_1b0->obj_ = (Instance *)0x0;
          local_1b0->store_ = (Store *)0x0;
          local_1b0->root_index_ = 0;
        }
        else {
          iVar32._M_current =
               ((local_1c8.obj_)->imports_).
               super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar32._M_current ==
              ((local_1c8.obj_)->imports_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
            _M_realloc_insert<wabt::interp::Ref_const&>
                      ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                       &(local_1c8.obj_)->imports_,iVar32,(Ref *)&local_1a8);
          }
          else {
            (iVar32._M_current)->index =
                 (size_t)local_1a8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->imports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
          }
          switch(*(undefined4 *)(*(long *)((long)&(pIVar1->type).type._M_t + lVar36) + 8)) {
          case 0:
            iVar32._M_current =
                 ((local_1c8.obj_)->funcs_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1c8.obj_)->funcs_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->funcs_;
LAB_002455db:
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>(this,iVar32,(Ref *)&local_1a8);
            }
            else {
              (iVar32._M_current)->index =
                   (size_t)local_1a8.
                           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              ((local_1c8.obj_)->funcs_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            }
            break;
          case 1:
            iVar32._M_current =
                 ((local_1c8.obj_)->tables_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1c8.obj_)->tables_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->tables_;
              goto LAB_002455db;
            }
            (iVar32._M_current)->index =
                 (size_t)local_1a8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->tables_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 2:
            iVar32._M_current =
                 ((local_1c8.obj_)->memories_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1c8.obj_)->memories_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->memories_;
              goto LAB_002455db;
            }
            (iVar32._M_current)->index =
                 (size_t)local_1a8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->memories_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 3:
            iVar32._M_current =
                 ((local_1c8.obj_)->globals_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1c8.obj_)->globals_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->globals_;
              goto LAB_002455db;
            }
            (iVar32._M_current)->index =
                 (size_t)local_1a8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
            break;
          case 4:
            iVar32._M_current =
                 ((local_1c8.obj_)->events_).
                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar32._M_current ==
                ((local_1c8.obj_)->events_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              this = (vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->events_;
              goto LAB_002455db;
            }
            (iVar32._M_current)->index =
                 (size_t)local_1a8.
                         super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            ((local_1c8.obj_)->events_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar32._M_current + 1;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.i64_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                     local_1f8._M_allocated_capacity);
        }
        if (iVar20 == 1) goto LAB_0024619c;
        lVar35 = lVar35 + 1;
        lVar36 = lVar36 + 0x48;
      } while (local_150 != lVar35);
    }
    pFVar3 = ((local_180.obj_)->desc_).funcs.
             super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_188 = out_trap;
    pIVar33 = local_1c8.obj_;
    for (pFVar29 = ((local_180.obj_)->desc_).funcs.
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar29 != pFVar3;
        pFVar29 = pFVar29 + 1) {
      pRVar22 = (Ref *)&Ref::Null;
      local_1c8.obj_ = pIVar33;
      if (local_1c8.store_ != (Store *)0x0) {
        pRVar22 = FreeList<wabt::interp::Ref>::Get
                            (&(local_1c8.store_)->roots_,local_1c8.root_index_);
      }
      pvVar4 = (void *)pRVar22->index;
      local_e0.type.super_ExternType.kind = (pFVar29->type).super_ExternType.kind;
      local_e0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002d0ad0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_e0.type.params,&(pFVar29->type).params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_e0.type.results,&(pFVar29->type).results);
      std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
                (&local_e0.locals,&pFVar29->locals);
      local_e0.code_offset = pFVar29->code_offset;
      local_1e8._M_unused._M_object = pvVar4;
      Store::
      Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
                ((RefPtr<wabt::interp::DefinedFunc> *)&local_208.v128_,store,store,(Ref *)&local_1e8
                 ,&local_e0);
      pRVar22 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar22 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar22->index;
      iVar32._M_current =
           (pIVar33->funcs_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar33->funcs_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar33->funcs_,iVar32,(Ref *)&local_1e8);
      }
      else {
        (iVar32._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        (pIVar33->funcs_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
        local_208.i64_ = 0;
        local_208._8_8_ = (Store *)0x0;
        local_1f8._M_allocated_capacity = 0;
      }
      if (local_e0.locals.
          super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.locals.
                        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_e0.type.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_002d0ad0;
      if (local_e0.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.type.results.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_e0.type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.type.params.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar33 = local_1c8.obj_;
    }
    pTVar5 = ((local_180.obj_)->desc_).tables.
             super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pTVar30 = ((local_180.obj_)->desc_).tables.
                   super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; pTVar30 != pTVar5;
        pTVar30 = pTVar30 + 1) {
      local_58.super_ExternType.kind = (pTVar30->type).super_ExternType.kind;
      local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002d0b10;
      local_58.limits._12_7_ =
           SUB87((ulong)*(undefined8 *)((long)&(pTVar30->type).limits.max + 3) >> 8,0);
      local_58._12_8_ = *(undefined8 *)&(pTVar30->type).super_ExternType.field_0xc;
      uVar16 = *(undefined8 *)((long)&(pTVar30->type).limits.initial + 4);
      local_58.limits._4_7_ = SUB87(uVar16,0);
      local_58.limits.max._3_1_ = (undefined1)((ulong)uVar16 >> 0x38);
      local_1c8.obj_ = pIVar33;
      Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
                ((RefPtr<wabt::interp::Table> *)&local_208.v128_,store,store,&local_58);
      pRVar22 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar22 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar22->index;
      iVar32._M_current =
           (pIVar33->tables_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar33->tables_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar33->tables_,iVar32,(Ref *)&local_1e8);
      }
      else {
        (iVar32._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        (pIVar33->tables_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
      }
      pIVar33 = local_1c8.obj_;
    }
    pMVar6 = ((local_180.obj_)->desc_).memories.
             super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pMVar31 = ((local_180.obj_)->desc_).memories.
                   super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar33,
        pMVar31 != pMVar6; pMVar31 = pMVar31 + 1) {
      local_80.super_ExternType.kind = (pMVar31->type).super_ExternType.kind;
      local_80.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002d0b50;
      local_80.limits.has_max = (pMVar31->type).limits.has_max;
      local_80.limits.is_shared = (pMVar31->type).limits.is_shared;
      local_80.limits.is_64 = (pMVar31->type).limits.is_64;
      local_80.limits._19_5_ = *(undefined5 *)&(pMVar31->type).limits.field_0x13;
      local_80.limits.initial = (pMVar31->type).limits.initial;
      local_80.limits.max = (pMVar31->type).limits.max;
      Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
                ((RefPtr<wabt::interp::Memory> *)&local_208.v128_,store,store,&local_80);
      pRVar22 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar22 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar22->index;
      iVar32._M_current =
           (pIVar33->memories_).
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar32._M_current ==
          (pIVar33->memories_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>(&pIVar33->memories_,iVar32,(Ref *)&local_1e8);
      }
      else {
        (iVar32._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        (pIVar33->memories_).
        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar32._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
      }
      pIVar33 = local_1c8.obj_;
    }
    pGVar27 = ((local_180.obj_)->desc_).globals.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pGVar7 = ((local_180.obj_)->desc_).globals.
             super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pGVar27 != pGVar7) {
      do {
        pIVar33 = local_1c8.obj_;
        local_140.super_ExternType.kind = (pGVar27->type).super_ExternType.kind;
        local_140.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002d0b90;
        local_140._12_8_ = *(undefined8 *)&(pGVar27->type).super_ExternType.field_0xc;
        ResolveInitExpr((Value *)&local_100.v128_,local_1c8.obj_,store,pGVar27->init);
        local_1f8._M_allocated_capacity = local_f0;
        local_208.i64_ = local_100.i64_;
        local_208._8_8_ = local_100._8_8_;
        Store::
        Alloc<wabt::interp::Global,wabt::interp::Store&,wabt::interp::GlobalType&,wabt::interp::Value&>
                  ((RefPtr<wabt::interp::Global> *)&local_1e8,store,store,&local_140,
                   (Value *)&local_208.v128_);
        pRVar22 = (Ref *)&Ref::Null;
        if ((Store *)local_1e8._8_8_ != (Store *)0x0) {
          pRVar22 = FreeList<wabt::interp::Ref>::Get
                              ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
        }
        local_208.i64_ = pRVar22->index;
        iVar32._M_current =
             (pIVar33->globals_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar32._M_current ==
            (pIVar33->globals_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
          _M_realloc_insert<wabt::interp::Ref>(&pIVar33->globals_,iVar32,&local_208.ref_);
        }
        else {
          (iVar32._M_current)->index = local_208.i64_;
          (pIVar33->globals_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar32._M_current + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          FreeList<wabt::interp::Ref>::Delete
                    ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
        }
        pGVar27 = pGVar27 + 1;
      } while (pGVar27 != pGVar7);
    }
    pEVar8 = ((local_180.obj_)->desc_).events.
             super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar33 = local_1c8.obj_;
    for (pEVar28 = ((local_180.obj_)->desc_).events.
                   super__Vector_base<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_1c8.obj_ = pIVar33,
        pEVar28 != pEVar8; pEVar28 = (pointer)((long)pEVar28 + 0x28)) {
      local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_002d0bd0;
      local_128.super_ExternType._8_8_ =
           (((EventType *)((long)pEVar28 + 8))->super_ExternType)._vptr_ExternType;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_128.signature,
                 (vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)pEVar28 + 0x10));
      Store::Alloc<wabt::interp::Event,wabt::interp::Store&,wabt::interp::EventType&>
                ((RefPtr<wabt::interp::Event> *)&local_208.v128_,store,store,&local_128);
      pRVar22 = (Ref *)&Ref::Null;
      if ((Store *)local_208._8_8_ != (Store *)0x0) {
        pRVar22 = FreeList<wabt::interp::Ref>::Get
                            ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                             local_1f8._M_allocated_capacity);
      }
      local_1e8._M_unused._0_8_ = (undefined8)pRVar22->index;
      iVar32._M_current =
           *(Ref **)&((RefVec *)((long)pIVar33 + 200))->
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>;
      if (iVar32._M_current ==
          *(Ref **)&((RefVec *)((long)pIVar33 + 0xd0))->
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>) {
        std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
        _M_realloc_insert<wabt::interp::Ref>
                  ((RefVec *)((long)pIVar33 + 0xc0),iVar32,(Ref *)&local_1e8);
      }
      else {
        (iVar32._M_current)->index = (size_t)local_1e8._M_unused._0_8_;
        *(Ref **)&((RefVec *)((long)pIVar33 + 200))->
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> =
             iVar32._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.i64_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete
                  ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
                   local_1f8._M_allocated_capacity);
        local_208.i64_ = 0;
        local_208._8_8_ = (Store *)0x0;
        local_1f8._M_allocated_capacity = 0;
      }
      local_128.super_ExternType._vptr_ExternType = (_func_int **)&PTR__EventType_002d0bd0;
      if (local_128.signature.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.signature.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pIVar33 = local_1c8.obj_;
    }
    pEVar38 = *(pointer *)&((ModuleDesc *)((long)local_180.obj_ + 0xe8))->func_types;
    pEVar9 = *(pointer *)&((ModuleDesc *)((long)local_180.obj_ + 0xf0))->func_types;
    if (pEVar38 != pEVar9) {
      do {
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pEVar38->type).type._M_t.
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
        switch(*(undefined4 *)((long)paVar23->_M_local_buf + 8)) {
        case 0:
          uVar34 = (ulong)pEVar38->index;
          pRVar25 = ((local_1c8.obj_)->funcs_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 1:
          uVar34 = (ulong)pEVar38->index;
          pRVar25 = ((local_1c8.obj_)->tables_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 2:
          uVar34 = (ulong)pEVar38->index;
          pRVar25 = ((local_1c8.obj_)->memories_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 3:
          uVar34 = (ulong)pEVar38->index;
          pRVar25 = ((local_1c8.obj_)->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        case 4:
          uVar34 = (ulong)pEVar38->index;
          pRVar25 = ((local_1c8.obj_)->events_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          break;
        default:
          goto switchD_00245c24_default;
        }
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pRVar25[uVar34].index;
        local_208.i64_ = (u64)paVar23;
switchD_00245c24_default:
        iVar32._M_current =
             ((local_1c8.obj_)->exports_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar32._M_current ==
            ((local_1c8.obj_)->exports_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
          _M_realloc_insert<wabt::interp::Ref_const&>
                    ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)
                     &(local_1c8.obj_)->exports_,iVar32,&local_208.ref_);
        }
        else {
          (iVar32._M_current)->index = (size_t)paVar23;
          ((local_1c8.obj_)->exports_).
          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar32._M_current + 1;
        }
        pEVar38 = pEVar38 + 1;
      } while (pEVar38 != pEVar9);
    }
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_180.obj_)->desc_).elems.
                 super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_180.obj_)->desc_).elems.
                 super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar23 != paVar10) {
      do {
        local_208.i64_ = (u64)paVar23;
        std::vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>>::
        emplace_back<wabt::interp::ElemDesc_const*,wabt::interp::RefPtr<wabt::interp::Instance>&>
                  ((vector<wabt::interp::ElemSegment,std::allocator<wabt::interp::ElemSegment>> *)
                   &(local_1c8.obj_)->elems_,(ElemDesc **)&local_208.i64_,&local_1c8);
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar23->_M_local_buf + 0x40);
      } while (paVar23 != paVar10);
    }
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_180.obj_)->desc_).datas.
                 super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((local_180.obj_)->desc_).datas.
                 super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (paVar23 != paVar10) {
      do {
        local_208.i64_ = (u64)paVar23;
        std::vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>>::
        emplace_back<wabt::interp::DataDesc_const*>
                  ((vector<wabt::interp::DataSegment,std::allocator<wabt::interp::DataSegment>> *)
                   &(local_1c8.obj_)->datas_,(DataDesc **)&local_208.i64_);
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar23 + 0x38);
      } while (paVar23 != paVar10);
    }
    bVar19 = (store->features_).bulk_memory_enabled_ == false;
    do {
      bVar17 = bVar19;
      pEVar11 = ((local_1c8.obj_)->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src = ((local_1c8.obj_)->elems_).
                 super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                 ._M_impl.super__Vector_impl_data._M_start; src != pEVar11; src = src + 1) {
        pEVar12 = src->desc_;
        if (pEVar12->mode == Declared) {
          pRVar25 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish != pRVar25) {
            (src->elements_).
            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
            super__Vector_impl_data._M_finish = pRVar25;
          }
        }
        else if (pEVar12->mode == Active) {
          RefPtr<wabt::interp::Table>::RefPtr
                    ((RefPtr<wabt::interp::Table> *)&local_1e8,store,
                     (Ref)((local_1c8.obj_)->tables_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pEVar12->table_index].index);
          pIVar33 = local_1c8.obj_;
          ResolveInitExpr((Value *)&local_208.v128_,local_1c8.obj_,store,pEVar12->offset);
          if (1 < local_1f8._M_allocated_capacity._0_4_ + 1) goto LAB_002462b7;
          uVar39 = local_208.i64_ & 0xffffffff;
          pRVar25 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pRVar26 = (src->elements_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar34 = (ulong)((long)pRVar26 - (long)pRVar25) >> 3;
          if (bVar17) {
            uVar24 = *(long *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                     *(long *)(local_1e8._M_unused._M_function_pointer + 0x68) >> 3;
            uVar34 = uVar34 & 0xffffffff;
            RVar21.enum_ = (Enum)(uVar24 - uVar34 < uVar39 || uVar24 < uVar34);
          }
          else {
            RVar21 = Table::Init((Table *)local_1e8._M_unused._0_8_,(Store *)pIVar33,local_208.i32_,
                                 src,0,(u32)uVar34);
            pRVar25 = (src->elements_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pRVar26 = pRVar25;
            if ((src->elements_).
                super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                super__Vector_impl_data._M_finish != pRVar25) {
              (src->elements_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish = pRVar25;
            }
          }
          if (RVar21.enum_ == Error) {
            StringPrintf_abi_cxx11_
                      ((string *)&local_208.v128_,
                       "out of bounds table access: elem segment is out of bounds: [%u, %lu) >= max value %u"
                       ,uVar39,((ulong)((long)pRVar26 - (long)pRVar25) >> 3 & 0xffffffff) + uVar39,
                       (ulong)(*(long *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                              *(long *)(local_1e8._M_unused._M_function_pointer + 0x68)) >> 3);
            goto LAB_002460f9;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_unused._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            FreeList<wabt::interp::Ref>::Delete
                      ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
          }
        }
      }
      pDVar13 = ((local_1c8.obj_)->datas_).
                super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (src_00 = ((local_1c8.obj_)->datas_).
                    super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
                    ._M_impl.super__Vector_impl_data._M_start; src_00 != pDVar13;
          src_00 = src_00 + 1) {
        pDVar14 = src_00->desc_;
        if (pDVar14->mode != Declared) {
          if (pDVar14->mode != Active) goto LAB_00245f75;
          RefPtr<wabt::interp::Memory>::RefPtr
                    ((RefPtr<wabt::interp::Memory> *)&local_1e8,store,
                     (Ref)((local_1c8.obj_)->memories_).
                          super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                          _M_impl.super__Vector_impl_data._M_start[pDVar14->memory_index].index);
          ResolveInitExpr((Value *)&local_208.v128_,local_1c8.obj_,store,pDVar14->offset);
          if (1 < local_1f8._M_allocated_capacity._0_4_ + 1) {
LAB_002462b7:
            __assert_fail("t == type || type == ValueType::Any",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.h"
                          ,0x22d,"void wabt::interp::Value::CheckType(ValueType) const");
          }
          uVar39 = local_208.i64_ & 0xffffffff;
          uVar34 = src_00->size_;
          if (bVar17) {
            uVar24 = *(long *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                     *(long *)(local_1e8._M_unused._M_function_pointer + 0x68);
            if (((uVar34 <= uVar24) && (uVar39 <= uVar24)) && (uVar34 + uVar39 <= uVar24)) {
LAB_00245f5a:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_unused._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                FreeList<wabt::interp::Ref>::Delete
                          ((FreeList<wabt::interp::Ref> *)(local_1e8._8_8_ + 0x68),local_1d8);
              }
              goto LAB_00245f75;
            }
          }
          else {
            RVar21 = Memory::Init((Memory *)local_1e8._M_unused._0_8_,uVar39,src_00,0,uVar34);
            src_00->size_ = 0;
            uVar34 = 0;
            if (RVar21.enum_ != Error) goto LAB_00245f5a;
          }
          StringPrintf_abi_cxx11_
                    ((string *)&local_208.v128_,
                     "out of bounds memory access: data segment is out of bounds: [%u, %lu) >= max value %lu"
                     ,uVar39,uVar34 + uVar39,
                     *(long *)(local_1e8._M_unused._M_function_pointer + 0x70) -
                     *(long *)(local_1e8._M_unused._M_function_pointer + 0x68));
LAB_002460f9:
          local_1a8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1a8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    (&local_168,store,store,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_208.v128_,&local_1a8);
          local_188->obj_ = local_168.obj_;
          local_188->store_ = local_168.store_;
          local_188->root_index_ = local_168.root_index_;
          local_168.root_index_ = 0;
          local_168.obj_ = (Trap *)0x0;
          local_168.store_ = (Store *)0x0;
          if (local_1a8.
              super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.i64_ != &local_1f8) {
            operator_delete((void *)local_208.i64_);
          }
          local_1b0->obj_ = (Instance *)0x0;
          local_1b0->store_ = (Store *)0x0;
          local_1b0->root_index_ = 0;
          uVar16 = local_1e8._8_8_;
          index = local_1d8;
          uVar18 = local_1e8._M_unused._0_8_;
          goto joined_r0x00246187;
        }
        src_00->size_ = 0;
LAB_00245f75:
      }
      bVar19 = false;
    } while (bVar17);
    pSVar37 = ((local_180.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar15 = ((local_180.obj_)->desc_).starts.
              super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar37 != pSVar15) {
      out_trap_00 = local_188;
LAB_00245fbc:
      RefPtr<wabt::interp::Func>::RefPtr
                ((RefPtr<wabt::interp::Func> *)&local_208.v128_,store,
                 (Ref)((local_1c8.obj_)->funcs_).
                      super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                      _M_impl.super__Vector_impl_data._M_start[pSVar37->func_index].index);
      local_1d8 = 0;
      local_1e8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1e8._8_8_ = (Store *)0x0;
      local_168.root_index_ = 0;
      local_168.obj_ = (Trap *)0x0;
      local_168.store_ = (Store *)0x0;
      RVar21 = Func::Call((Func *)local_208.i64_,store,(Values *)&local_168,(Values *)&local_1e8,
                          out_trap_00,(Stream *)0x0);
      if (local_168.obj_ != (Trap *)0x0) {
        operator_delete(local_168.obj_);
      }
      if (RVar21.enum_ != Error) goto code_r0x00246032;
      local_1b0->obj_ = (Instance *)0x0;
      local_1b0->store_ = (Store *)0x0;
      local_1b0->root_index_ = 0;
      uVar16 = local_208._8_8_;
      index = local_1f8._M_allocated_capacity;
      uVar18 = local_208.i64_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1e8._M_unused._M_object);
        uVar16 = local_208._8_8_;
        index = local_1f8._M_allocated_capacity;
        uVar18 = local_208.i64_;
      }
joined_r0x00246187:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar18 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        FreeList<wabt::interp::Ref>::Delete(&((Store *)uVar16)->roots_,index);
      }
      goto LAB_0024619c;
    }
LAB_00246071:
    local_1b0->obj_ = local_1c8.obj_;
    local_1b0->store_ = local_1c8.store_;
    local_1b0->root_index_ = local_1c8.root_index_;
  }
  if (local_180.obj_ != (Module *)0x0) {
    FreeList<wabt::interp::Ref>::Delete(&(local_180.store_)->roots_,local_180.root_index_);
  }
  return local_1b0;
code_r0x00246032:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_unused._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1e8._M_unused._M_object);
  }
  out_trap_00 = local_188;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.i64_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    FreeList<wabt::interp::Ref>::Delete
              ((FreeList<wabt::interp::Ref> *)(local_208._8_8_ + 0x68),
               local_1f8._M_allocated_capacity);
  }
  pSVar37 = pSVar37 + 1;
  if (pSVar37 == pSVar15) goto LAB_00246071;
  goto LAB_00245fbc;
}

Assistant:

Instance::Ptr Instance::Instantiate(Store& store,
                                    Ref module,
                                    const RefVec& imports,
                                    Trap::Ptr* out_trap) {
  Module::Ptr mod{store, module};
  Instance::Ptr inst = store.Alloc<Instance>(store, module);

  size_t import_desc_count = mod->desc().imports.size();
  if (imports.size() < import_desc_count) {
    *out_trap = Trap::New(store, "not enough imports!");
    return {};
  }

  // Imports.
  for (size_t i = 0; i < import_desc_count; ++i) {
    auto&& import_desc = mod->desc().imports[i];
    Ref extern_ref = imports[i];
    if (extern_ref == Ref::Null) {
      *out_trap = Trap::New(store, StringPrintf("invalid import \"%s.%s\"",
                                                import_desc.type.module.c_str(),
                                                import_desc.type.name.c_str()));
      return {};
    }

    Extern::Ptr extern_{store, extern_ref};
    if (Failed(extern_->Match(store, import_desc.type, out_trap))) {
      return {};
    }

    inst->imports_.push_back(extern_ref);

    switch (import_desc.type.type->kind) {
      case ExternKind::Func:   inst->funcs_.push_back(extern_ref); break;
      case ExternKind::Table:  inst->tables_.push_back(extern_ref); break;
      case ExternKind::Memory: inst->memories_.push_back(extern_ref); break;
      case ExternKind::Global: inst->globals_.push_back(extern_ref); break;
      case ExternKind::Event:  inst->events_.push_back(extern_ref); break;
    }
  }

  // Funcs.
  for (auto&& desc : mod->desc().funcs) {
    inst->funcs_.push_back(DefinedFunc::New(store, inst.ref(), desc).ref());
  }

  // Tables.
  for (auto&& desc : mod->desc().tables) {
    inst->tables_.push_back(Table::New(store, desc.type).ref());
  }

  // Memories.
  for (auto&& desc : mod->desc().memories) {
    inst->memories_.push_back(Memory::New(store, desc.type).ref());
  }

  // Globals.
  for (auto&& desc : mod->desc().globals) {
    inst->globals_.push_back(
        Global::New(store, desc.type, inst->ResolveInitExpr(store, desc.init))
            .ref());
  }

  // Events.
  for (auto&& desc : mod->desc().events) {
    inst->events_.push_back(Event::New(store, desc.type).ref());
  }

  // Exports.
  for (auto&& desc : mod->desc().exports){
    Ref ref;
    switch (desc.type.type->kind) {
      case ExternKind::Func:   ref = inst->funcs_[desc.index]; break;
      case ExternKind::Table:  ref = inst->tables_[desc.index]; break;
      case ExternKind::Memory: ref = inst->memories_[desc.index]; break;
      case ExternKind::Global: ref = inst->globals_[desc.index]; break;
      case ExternKind::Event:  ref = inst->events_[desc.index]; break;
    }
    inst->exports_.push_back(ref);
  }

  // Elems.
  for (auto&& desc : mod->desc().elems) {
    inst->elems_.emplace_back(&desc, inst);
  }

  // Datas.
  for (auto&& desc : mod->desc().datas) {
    inst->datas_.emplace_back(&desc);
  }

  // Initialization.
  enum Pass { Check, Init };
  int pass = store.features().bulk_memory_enabled() ? Init : Check;
  for (; pass <= Init; ++pass) {
    // Elems.
    for (auto&& segment : inst->elems_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Table::Ptr table{store, inst->tables_[desc.table_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = table->IsValidRange(offset, segment.size()) ? Result::Ok
                                                               : Result::Error;
        } else {
          result = table->Init(store, offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store, StringPrintf(
                         "out of bounds table access: elem segment is "
                         "out of bounds: [%u, %" PRIu64 ") >= max value %u",
                         offset, u64{offset} + segment.size(), table->size()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }

    // Data.
    for (auto&& segment : inst->datas_) {
      auto&& desc = segment.desc();
      if (desc.mode == SegmentMode::Active) {
        Result result;
        Memory::Ptr memory{store, inst->memories_[desc.memory_index]};
        u32 offset = inst->ResolveInitExpr(store, desc.offset).Get<u32>();
        if (pass == Check) {
          result = memory->IsValidAccess(offset, 0, segment.size())
                       ? Result::Ok
                       : Result::Error;
        } else {
          result = memory->Init(offset, segment, 0, segment.size());
          segment.Drop();
        }

        if (Failed(result)) {
          *out_trap = Trap::New(
              store,
              StringPrintf("out of bounds memory access: data segment is "
                           "out of bounds: [%u, %" PRIu64 ") >= max value %"
                           PRIu64, offset, u64{offset} + segment.size(),
                           memory->ByteSize()));
          return {};
        }
      } else if (desc.mode == SegmentMode::Declared) {
        segment.Drop();
      }
    }
  }

  // Start.
  for (auto&& start : mod->desc().starts) {
    Func::Ptr func{store, inst->funcs_[start.func_index]};
    Values results;
    if (Failed(func->Call(store, {}, results, out_trap))) {
      return {};
    }
  }

  return inst;
}